

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O0

double __thiscall despot::MDPUpperBound::Value(MDPUpperBound *this,Belief *belief)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  const_reference ppSVar5;
  const_reference pvVar6;
  State *particle;
  double dStack_28;
  int i;
  double value;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  Belief *belief_local;
  MDPUpperBound *this_local;
  
  iVar2 = (*belief->_vptr_Belief[6])();
  dStack_28 = 0.0;
  particle._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                       CONCAT44(extraout_var,iVar2));
    if (sVar4 <= (ulong)(long)particle._4_4_) break;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         CONCAT44(extraout_var,iVar2),(long)particle._4_4_);
    dVar1 = (*ppSVar5)->weight;
    iVar3 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,*ppSVar5);
    pvVar6 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       (&this->policy_,(long)iVar3);
    dStack_28 = dVar1 * pvVar6->value + dStack_28;
    particle._4_4_ = particle._4_4_ + 1;
  }
  return dStack_28;
}

Assistant:

double MDPUpperBound::Value(const Belief* belief) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * policy_[indexer_.GetIndex(particle)].value;
	}
	return value;
}